

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O3

void __thiscall Test::Assertion::Assertion(Assertion *this,char *fileName,uint32_t lineNum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_49;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->suite).field_2;
  (this->suite)._M_dataplus._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  std::__cxx11::string::string((string *)&this->file,fileName,&local_49);
  paVar1 = &(this->method).field_2;
  (this->method)._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->method,"");
  (this->args)._M_dataplus._M_p = (pointer)&(this->args).field_2;
  local_48 = paVar1;
  local_40 = &this->method;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->args,"");
  (this->errorMessage)._M_dataplus._M_p = (pointer)&(this->errorMessage).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->errorMessage,"");
  (this->userMessage)._M_dataplus._M_p = (pointer)&(this->userMessage).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->userMessage,"");
  this->lineNumber = lineNum;
  return;
}

Assistant:

Assertion::Assertion(const char *fileName, uint32_t lineNum)
    : suite(""), file(fileName), method(""), args(""), errorMessage(""), userMessage(""), lineNumber(lineNum) {}